

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O3

void arm::display_reg_name(ostream *o,Reg r)

{
  char *pcVar1;
  
  if (r == 0xf) {
    pcVar1 = "pc";
  }
  else if (r == 0xe) {
    pcVar1 = "lr";
  }
  else {
    if (r != 0xd) {
      if (r < 0x10) {
        std::__ostream_insert<char,std::char_traits<char>>(o,"r",1);
      }
      else if (r < 0x30) {
        std::__ostream_insert<char,std::char_traits<char>>(o,"d",1);
      }
      else if (r < 0x40) {
        std::__ostream_insert<char,std::char_traits<char>>(o,"q",1);
      }
      else if ((int)r < 0) {
        if (r < 0xc0000000) {
          std::__ostream_insert<char,std::char_traits<char>>(o,"vd",2);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(o,"vq",2);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(o,"v",1);
      }
      std::ostream::_M_insert<unsigned_long>((ulong)o);
      return;
    }
    pcVar1 = "sp";
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,pcVar1,2);
  return;
}

Assistant:

void display_reg_name(std::ostream &o, Reg r) {
  if (r == REG_SP)
    o << "sp";
  else if (r == REG_LR)
    o << "lr";
  else if (r == REG_PC)
    o << "pc";
  else
    switch (register_type(r)) {
      case RegisterKind::GeneralPurpose:
        o << "r" << register_num(r);
        break;
      case RegisterKind::DoubleVector:
        o << "d" << register_num(r);
        break;
      case RegisterKind::QuadVector:
        o << "q" << register_num(r);
        break;
      case RegisterKind::VirtualGeneralPurpose:
        o << "v" << register_num(r);
        break;
      case RegisterKind::VirtualDoubleVector:
        o << "vd" << register_num(r);
        break;
      case RegisterKind::VirtualQuadVector:
        o << "vq" << register_num(r);
        break;
    }
}